

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDB.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_16bd48::SQLiteBuildDB::buildStarted(SQLiteBuildDB *this,string *error_out)

{
  uint uVar1;
  int __oflag;
  string local_50;
  int local_30;
  undefined4 local_2c;
  int result;
  lock_guard<std::mutex> guard;
  string *error_out_local;
  SQLiteBuildDB *this_local;
  
  guard._M_device = (mutex_type *)error_out;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&result,&this->dbMutex);
  uVar1 = open(this,(char *)guard._M_device,__oflag);
  if ((uVar1 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    local_30 = sqlite3_exec(this->db,"BEGIN EXCLUSIVE;",0,0);
    if (local_30 == 0) {
      this_local._7_1_ = true;
    }
    else {
      (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_50,this);
      std::__cxx11::string::operator=((string *)guard._M_device,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      this_local._7_1_ = false;
    }
  }
  local_2c = 1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&result);
  return this_local._7_1_;
}

Assistant:

virtual bool buildStarted(std::string *error_out) override {
    std::lock_guard<std::mutex> guard(dbMutex);

    if (!open(error_out))
      return false;

    // Execute the entire build inside a single transaction.
    //
    // FIXME: We should revist this, as we probably wouldn't want a crash in the
    // build system to totally lose all build results.
    int result = sqlite3_exec(db, "BEGIN EXCLUSIVE;", nullptr, nullptr, nullptr);

    if (result != SQLITE_OK) {
      *error_out = getCurrentErrorMessage();
      return false;
    }

    return true;
  }